

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O3

time_t fs_get_modtime(string_view path)

{
  int iVar1;
  int *piVar2;
  string_view fname;
  stat s;
  statx sx;
  stat local_1a0;
  undefined1 local_110 [112];
  time_t local_a0;
  
  iVar1 = statx(0xffffff9c,path._M_str,0x800,0x40,local_110);
  if ((iVar1 != 0) &&
     ((piVar2 = __errno_location(), *piVar2 != 0x26 ||
      (iVar1 = stat(path._M_str,&local_1a0), local_a0 = local_1a0.st_mtim.tv_sec, iVar1 != 0)))) {
    fname._M_str = "fs_get_modtime";
    fname._M_len = 0xe;
    fs_print_error(path,fname);
    local_a0 = 0;
  }
  return local_a0;
}

Assistant:

std::time_t fs_get_modtime(std::string_view path)
{

#if defined(HAVE_CLOCK_CAST) && defined(HAVE_CXX_FILESYSTEM)
  if(const auto &t_fs = fs_get_modtime_fs(path); t_fs){
    const auto t_sys = std::chrono::clock_cast<std::chrono::system_clock>(t_fs.value());
    return std::chrono::system_clock::to_time_t(t_sys);
  }
#else

  int r = 0;

#if defined(STATX_MTIME) && defined(USE_STATX)
// https://www.man7.org/linux/man-pages/man2/statx.2.html
  struct statx sx;
  r = statx(AT_FDCWD, path.data(), AT_NO_AUTOMOUNT, STATX_MTIME, &sx);
  if (r == 0) FFS_LIKELY
    return sx.stx_mtime.tv_sec;
#endif
  if (r == 0 || errno == ENOSYS){
    if (struct stat s; !stat(path.data(), &s))
      return s.st_mtime;
  }
#endif

  fs_print_error(path, __func__);
  return {};
}